

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O2

ptr<out_of_log_msg> __thiscall nuraft::out_of_log_msg::deserialize(out_of_log_msg *this,buffer *buf)

{
  uint64_t uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<out_of_log_msg> pVar2;
  buffer_serializer bs;
  buffer_serializer bStack_28;
  
  std::make_shared<nuraft::out_of_log_msg>();
  buffer_serializer::buffer_serializer(&bStack_28,buf,LITTLE);
  buffer_serializer::get_u8(&bStack_28);
  uVar1 = buffer_serializer::get_u64(&bStack_28);
  *(uint64_t *)this->start_idx_of_leader_ = uVar1;
  pVar2.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<out_of_log_msg>)
         pVar2.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<out_of_log_msg> out_of_log_msg::deserialize(buffer& buf) {
    ptr<out_of_log_msg> ret = cs_new<out_of_log_msg>();

    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    ret->start_idx_of_leader_ = bs.get_u64();
    return ret;
}